

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

ImageT<unsigned_short,_4U> * __thiscall
ImageT<unsigned_short,4u>::copyTo<ImageT<unsigned_short,3u>>
          (ImageT<unsigned_short,4u> *this,ImageT<unsigned_short,_3U> *dst,string_view swizzle)

{
  long lVar1;
  unsigned_short uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong local_48;
  
  iVar3 = (**(code **)(*(long *)this + 0x30))(this,dst,swizzle._M_len);
  iVar4 = (**(code **)(*(long *)dst + 0x30))(dst);
  if (iVar3 != iVar4) {
    __assert_fail("getComponentSize() == dst.getComponentSize()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50a,
                  "ImageT<componentType, componentCount> &ImageT<unsigned short, 4>::copyTo(DstImage &, std::string_view) [componentType = unsigned short, componentCount = 4, DstImage = ImageT<unsigned short, 3>]"
                 );
  }
  if ((*(int *)(this + 8) != *(int *)(dst + 8)) || (*(int *)(this + 0xc) != *(int *)(dst + 0xc))) {
    __assert_fail("width == dst.getWidth() && height == dst.getHeight()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50b,
                  "ImageT<componentType, componentCount> &ImageT<unsigned short, 4>::copyTo(DstImage &, std::string_view) [componentType = unsigned short, componentCount = 4, DstImage = ImageT<unsigned short, 3>]"
                 );
  }
  *(undefined8 *)(dst + 0x10) = *(undefined8 *)(this + 0x10);
  if (*(int *)(this + 0xc) * *(int *)(this + 8) != 0) {
    lVar9 = 0;
    local_48 = 0;
    do {
      iVar3 = (**(code **)(*(long *)dst + 0x28))(dst);
      uVar5 = 0;
      if (iVar3 != 0) {
        uVar8 = 0;
        do {
          uVar5 = (**(code **)(*(long *)this + 0x28))(this);
          if (uVar5 <= uVar8) break;
          lVar1 = *(long *)(dst + 0x18);
          uVar2 = ImageT<unsigned_short,_4U>::swizzlePixel
                            ((ImageT<unsigned_short,_4U> *)this,
                             (Color *)(*(long *)(this + 0x18) + local_48 * 8),swizzle._M_str[uVar8])
          ;
          uVar7 = 2;
          if ((uint)uVar8 < 2) {
            uVar7 = uVar8 & 0xffffffff;
          }
          *(unsigned_short *)(lVar1 + local_48 * 6 + uVar7 * 2) = uVar2;
          uVar8 = uVar8 + 1;
          uVar5 = (**(code **)(*(long *)dst + 0x28))(dst);
        } while (uVar8 < uVar5);
        uVar5 = (uint)uVar8;
      }
      uVar6 = (**(code **)(*(long *)dst + 0x28))(dst);
      if (uVar5 < uVar6) {
        uVar8 = (ulong)uVar5;
        do {
          if (uVar8 < 3) {
            *(undefined2 *)(*(long *)(dst + 0x18) + lVar9 + uVar8 * 2) = 0;
          }
          else {
            *(undefined2 *)(*(long *)(dst + 0x18) + 4 + local_48 * 6) = 0xffff;
          }
          uVar8 = uVar8 + 1;
          uVar5 = (**(code **)(*(long *)dst + 0x28))(dst);
        } while (uVar8 < uVar5);
      }
      local_48 = local_48 + 1;
      lVar9 = lVar9 + 6;
    } while (local_48 < (uint)(*(int *)(this + 0xc) * *(int *)(this + 8)));
  }
  return (ImageT<unsigned_short,_4U> *)this;
}

Assistant:

ImageT& copyTo(DstImage& dst, std::string_view swizzle) {
        assert(getComponentSize() == dst.getComponentSize());
        assert(width == dst.getWidth() && height == dst.getHeight());

        dst.setTransferFunction(transferFunction);
        dst.setPrimaries(primaries);
        for (size_t i = 0; i < getPixelCount(); i++) {
            uint32_t c;
            for (c = 0; c < dst.getComponentCount(); c++) {
                if (c < getComponentCount())
                    dst.pixels[i].set(c, swizzlePixel(pixels[i], swizzle[c]));
                else
                    break;
            }
            for (; c < dst.getComponentCount(); c++)
                if (c < 3)
                    dst.pixels[i].set(c, componentType{0});
                else
                    dst.pixels[i].set(c, Color::one());
        }
        return *this;
    }